

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void calc_adj(void)

{
  int iVar1;
  int local_20;
  int local_1c;
  int jj;
  int ii;
  int j_1;
  int i_1;
  int j;
  int i;
  
  for (i_1 = 1; i_1 <= bsize; i_1 = i_1 + 1) {
    for (j_1 = 1; j_1 <= bsize; j_1 = j_1 + 1) {
      adj[1][i_1][j_1] = 0;
      (*adj)[i_1][j_1] = 0;
    }
  }
  for (ii = 1; ii <= bsize; ii = ii + 1) {
    for (jj = 1; jj <= bsize; jj = jj + 1) {
      if (board[ii][jj] == '\0') {
        for (local_1c = -1; local_1c < 2; local_1c = local_1c + 1) {
          for (local_20 = -1; local_20 < 2; local_20 = local_20 + 1) {
            if (((local_1c + local_20) % 2 != 0) && ('\x01' < board[ii + local_1c][jj + local_20]))
            {
              iVar1 = score_word(ii,jj,local_20 != 0,true,true);
              adj[local_1c * local_1c][ii][jj] = iVar1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void calc_adj() {
    for (int i = 1; i <= bsize; i++)
        for (int j = 1; j <= bsize; j++)
            adj[0][i][j] = adj[1][i][j] = 0;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) {
                for (int ii = -1; ii <= 1; ii++) {
                    for (int jj = -1; jj <= 1; jj++) {
                        if ((ii + jj) % 2 && board[i + ii][j + jj] > 1) {
                            //board[i][j]='A'+26; // dummy character to discount ij
                            adj[ii * ii][i][j] = score_word(i, j, jj != 0, true, true);
                            //board[i][j]=0;
                        }
                    }
                }
            }
        }
    }
}